

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O1

int Ifd_ManDsdTest4(void)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  Vec_Int_t *__ptr;
  long lVar4;
  long lVar5;
  int pPerm [6];
  int local_48 [8];
  
  local_48[0] = 0;
  local_48[1] = 1;
  local_48[2] = 2;
  local_48[3] = 3;
  local_48[4] = 4;
  local_48[5] = 5;
  __ptr = Ifd_ManDsdPermJT(6);
  iVar1 = __ptr->nSize;
  if (0 < (long)iVar1) {
    piVar3 = __ptr->pArray;
    lVar5 = 0;
    do {
      lVar4 = (long)piVar3[lVar5];
      iVar2 = local_48[lVar4];
      local_48[lVar4] = local_48[lVar4 + 1];
      local_48[lVar4 + 1] = iVar2;
      Ifd_ManDsdPermPrint(local_48,6);
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  return 1;
}

Assistant:

int Ifd_ManDsdTest4() 
{
    int pPerm[6] = { 0, 1, 2, 3, 4, 5 };
    Vec_Int_t * vGuide = Ifd_ManDsdPermJT( 6 );
    int i, Entry;
    Vec_IntForEachEntry( vGuide, Entry, i )
    {
        ABC_SWAP( int, pPerm[Entry], pPerm[Entry+1] );
        Ifd_ManDsdPermPrint( pPerm, 6 );
    }
    Vec_IntFree( vGuide );
    return 1;
}